

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O3

optional<pbrt::Bounds2<float>_> * __thiscall
pbrt::PortalImageInfiniteLight::ImageBounds
          (optional<pbrt::Bounds2<float>_> *__return_storage_ptr__,PortalImageInfiniteLight *this,
          Point3f *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  aligned_storage_t<sizeof(pbrt::Bounds2<float>),_alignof(pbrt::Bounds2<float>)> aVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  Vector3f wRender;
  Vector3f wRender_00;
  optional<pbrt::Point2<float>_> p1;
  optional<pbrt::Point2<float>_> p0;
  undefined1 local_40 [24];
  char local_28;
  
  uVar1 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar5 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar16._4_4_ = uVar5;
  auVar16._0_4_ = uVar1;
  auVar16._8_8_ = 0;
  fVar10 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.z -
           (p->super_Tuple3<pbrt::Point3,_float>).z;
  uVar2 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.x;
  uVar6 = (this->portal).values[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar11._4_4_ = uVar6;
  auVar11._0_4_ = uVar2;
  auVar11._8_8_ = 0;
  auVar12 = vsubps_avx(auVar11,auVar16);
  auVar17._0_4_ = auVar12._0_4_ * auVar12._0_4_;
  auVar17._4_4_ = auVar12._4_4_ * auVar12._4_4_;
  auVar17._8_4_ = auVar12._8_4_ * auVar12._8_4_;
  auVar17._12_4_ = auVar12._12_4_ * auVar12._12_4_;
  auVar11 = vhaddps_avx(auVar17,auVar17);
  auVar11 = ZEXT416((uint)(auVar11._0_4_ + fVar10 * fVar10));
  auVar11 = vsqrtss_avx(auVar11,auVar11);
  fVar15 = auVar11._0_4_;
  auVar20._4_4_ = fVar15;
  auVar20._0_4_ = fVar15;
  auVar20._8_4_ = fVar15;
  auVar20._12_4_ = fVar15;
  wRender.super_Tuple3<pbrt::Vector3,_float>.z = fVar10 / fVar15;
  auVar11 = vdivps_avx(auVar12,auVar20);
  wRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar11._0_8_;
  ImageFromRender((PortalImageInfiniteLight *)(local_40 + 0x10),wRender,(Float *)this);
  uVar3 = (p->super_Tuple3<pbrt::Point3,_float>).x;
  uVar7 = (p->super_Tuple3<pbrt::Point3,_float>).y;
  auVar18._4_4_ = uVar7;
  auVar18._0_4_ = uVar3;
  auVar18._8_8_ = 0;
  fVar10 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.z -
           (p->super_Tuple3<pbrt::Point3,_float>).z;
  uVar4 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.x;
  uVar8 = (this->portal).values[2].super_Tuple3<pbrt::Point3,_float>.y;
  auVar12._4_4_ = uVar8;
  auVar12._0_4_ = uVar4;
  auVar12._8_8_ = 0;
  auVar12 = vsubps_avx(auVar12,auVar18);
  auVar19._0_4_ = auVar12._0_4_ * auVar12._0_4_;
  auVar19._4_4_ = auVar12._4_4_ * auVar12._4_4_;
  auVar19._8_4_ = auVar12._8_4_ * auVar12._8_4_;
  auVar19._12_4_ = auVar12._12_4_ * auVar12._12_4_;
  auVar11 = vhaddps_avx(auVar19,auVar19);
  auVar11 = ZEXT416((uint)(auVar11._0_4_ + fVar10 * fVar10));
  auVar11 = vsqrtss_avx(auVar11,auVar11);
  fVar15 = auVar11._0_4_;
  auVar21._4_4_ = fVar15;
  auVar21._0_4_ = fVar15;
  auVar21._8_4_ = fVar15;
  auVar21._12_4_ = fVar15;
  wRender_00.super_Tuple3<pbrt::Vector3,_float>.z = fVar10 / fVar15;
  auVar11 = vdivps_avx(auVar12,auVar21);
  wRender_00.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar11._0_8_;
  ImageFromRender((PortalImageInfiniteLight *)local_40,wRender_00,(Float *)this);
  if ((local_28 == '\x01') && ((local_40[8] & 1) != 0)) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_40._0_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_40._16_8_;
    __return_storage_ptr__->set = true;
    auVar12 = vminps_avx(auVar13,auVar14);
    auVar11 = vmaxps_avx(auVar13,auVar14);
    aVar9 = (aligned_storage_t<sizeof(pbrt::Bounds2<float>),_alignof(pbrt::Bounds2<float>)>)
            vmovlhps_avx(auVar12,auVar11);
    __return_storage_ptr__->optionalValue = aVar9;
  }
  else {
    *(undefined4 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<Bounds2f> ImageBounds(const Point3f &p) const {
        pstd::optional<Point2f> p0 = ImageFromRender(Normalize(portal[0] - p));
        pstd::optional<Point2f> p1 = ImageFromRender(Normalize(portal[2] - p));
        if (!p0 || !p1)
            return {};
        return Bounds2f(*p0, *p1);
    }